

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ProgramBinaryCase::getBinaryFormats
          (ProgramBinaryCase *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *out)

{
  reference data;
  value_type_conflict2 local_20;
  GLint local_1c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_18;
  GLint numFormats;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *out_local;
  ProgramBinaryCase *this_local;
  
  local_1c = -1;
  pvStack_18 = out;
  out_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  glu::CallLogWrapper::glGetIntegerv(&this->super_CallLogWrapper,0x87fe,&local_1c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(pvStack_18);
  if (0 < local_1c) {
    local_20 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (pvStack_18,(long)local_1c,&local_20);
    data = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvStack_18,0);
    glu::CallLogWrapper::glGetIntegerv(&this->super_CallLogWrapper,0x87ff,(GLint *)data);
  }
  return;
}

Assistant:

void ProgramBinaryCase::getBinaryFormats (std::vector<GLenum>& out)
{
	GLint numFormats = -1;
	glGetIntegerv(GL_NUM_PROGRAM_BINARY_FORMATS, &numFormats);

	out.clear();

	if (numFormats > 0)
	{
		out.resize(numFormats, 0);

		glGetIntegerv(GL_PROGRAM_BINARY_FORMATS, (GLint*)&out[0]);
	}
}